

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_test_registry.hpp
# Opt level: O0

void __thiscall
Catch::
TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>,_3UL>_>_>
::invoke(TestInvokerAsMethod<(anonymous_namespace)::CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>,_3UL>_>_>
         *this)

{
  long *plVar1;
  long in_RDI;
  CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>,_3UL>_>
  obj;
  code *local_80;
  long local_50 [10];
  
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>,_3UL>_>
  ::CATCH2_INTERNAL_TEMPLATE_TEST_174
            ((CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>,_3UL>_>
              *)0x924576);
  local_80 = *(code **)(in_RDI + 8);
  plVar1 = (long *)((long)local_50 + *(long *)(in_RDI + 0x10));
  if (((ulong)local_80 & 1) != 0) {
    local_80 = *(code **)(local_80 + *plVar1 + -1);
  }
  (*local_80)(plVar1);
  anon_unknown.dwarf_70180c::
  CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>,_3UL>_>
  ::~CATCH2_INTERNAL_TEMPLATE_TEST_174
            ((CATCH2_INTERNAL_TEMPLATE_TEST_174<slang::SmallVector<std::pair<(anonymous_namespace)::Constructable,_(anonymous_namespace)::Constructable>,_3UL>_>
              *)0x9245dd);
  return;
}

Assistant:

void invoke() const override {
        C obj;
        (obj.*m_testAsMethod)();
    }